

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::findAndNotifyInputTargets
          (CoreBroker *this,BasicHandleInfo *handleInfo,string *key)

{
  bool bVar1;
  BrokerState BVar2;
  iterator this_00;
  iterator origin;
  reference ppVar3;
  BasicHandleInfo *pBVar4;
  string *in_RSI;
  BasicHandleInfo *pub_1;
  pair<helics::GlobalHandle,_unsigned_short> *target_1;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  *__range2;
  BasicHandleInfo *pub;
  pair<helics::GlobalHandle,_unsigned_short> *target;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  *__range1;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  Handles;
  string *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  uint in_stack_fffffffffffffd34;
  UnknownHandleManager *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  uint in_stack_fffffffffffffd44;
  GlobalHandle in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffe88;
  InterfaceHandle targetFlags;
  BasicHandleInfo *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  uint32_t originFlags;
  BasicHandleInfo *in_stack_fffffffffffffea0;
  __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  in_stack_fffffffffffffea8;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
  in_stack_fffffffffffffeb0;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t> actions;
  __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  local_40;
  undefined1 *local_38;
  undefined1 local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  UnknownHandleManager::checkForInputs
            (in_stack_fffffffffffffd38,
             (string *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  local_38 = local_30;
  local_40._M_current =
       (pair<helics::GlobalHandle,_unsigned_short> *)
       CLI::std::
       vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
       ::begin((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                *)in_stack_fffffffffffffd28);
  CLI::std::
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  ::end((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
         *)in_stack_fffffffffffffd28);
  while (bVar1 = __gnu_cxx::
                 operator==<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                           ((__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                            (__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                             *)in_stack_fffffffffffffd28), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
    ::operator*(&local_40);
    pBVar4 = HandleManager::findHandle
                       ((HandleManager *)
                        CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                        in_stack_fffffffffffffd48);
    if (pBVar4 == (BasicHandleInfo *)0x0) {
      BasicHandleInfo::BasicHandleInfo
                ((BasicHandleInfo *)in_stack_fffffffffffffd48,
                 (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                 (InterfaceHandle)(BaseType)in_stack_fffffffffffffd50,
                 (InterfaceType)(in_stack_fffffffffffffd44 >> 0x18));
      std::make_pair<helics::action_message_def::action_t,helics::action_message_def::action_t>
                ((action_t *)in_stack_fffffffffffffd28,(action_t *)0x5f690b);
      connectInterfaces((CoreBroker *)in_stack_fffffffffffffea8._M_current,in_stack_fffffffffffffea0
                        ,(uint32_t)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                        in_stack_fffffffffffffe90,
                        (uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                        in_stack_fffffffffffffeb0);
      BasicHandleInfo::~BasicHandleInfo
                ((BasicHandleInfo *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    }
    else {
      std::make_pair<helics::action_message_def::action_t,helics::action_message_def::action_t>
                ((action_t *)in_stack_fffffffffffffd28,(action_t *)0x5f6a06);
      connectInterfaces((CoreBroker *)in_stack_fffffffffffffea8._M_current,in_stack_fffffffffffffea0
                        ,(uint32_t)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                        in_stack_fffffffffffffe90,
                        (uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                        in_stack_fffffffffffffeb0);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
    ::operator++(&local_40);
  }
  bVar1 = CLI::std::
          vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
          ::empty((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  if (!bVar1) {
    UnknownHandleManager::clearInput
              ((UnknownHandleManager *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)
               ,in_stack_fffffffffffffd28);
  }
  BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x5f6a9c);
  if (BVar2 == OPERATING) {
    UnknownHandleManager::checkForReconnectionInputs
              (in_stack_fffffffffffffd38,
               (string *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::operator=((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                 *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                (vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                 *)in_stack_fffffffffffffd38);
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::~vector((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
               *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    actions = (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>)
              local_30;
    this_00 = CLI::std::
              vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
              ::begin((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                       *)in_stack_fffffffffffffd28);
    origin = CLI::std::
             vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ::end((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                    *)in_stack_fffffffffffffd28);
    while (bVar1 = __gnu_cxx::
                   operator==<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                             ((__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                              (__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                               *)in_stack_fffffffffffffd28), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
               ::operator*((__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                            *)&stack0xfffffffffffffea8);
      targetFlags = (ppVar3->first).handle;
      pBVar4 = HandleManager::findHandle
                         ((HandleManager *)
                          CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                          in_stack_fffffffffffffd48);
      if (pBVar4 == (BasicHandleInfo *)0x0) {
        BasicHandleInfo::BasicHandleInfo
                  ((BasicHandleInfo *)in_stack_fffffffffffffd48,
                   (GlobalFederateId)(BaseType)((ulong)local_10 >> 0x20),
                   (InterfaceHandle)(BaseType)local_10,
                   (InterfaceType)(in_stack_fffffffffffffd44 >> 0x18));
        originFlags = (uint32_t)((ulong)ppVar3 >> 0x20);
        std::make_pair<helics::action_message_def::action_t,helics::action_message_def::action_t>
                  ((action_t *)in_stack_fffffffffffffd28,(action_t *)0x5f6c4e);
        connectInterfaces((CoreBroker *)this_00._M_current,(BasicHandleInfo *)origin._M_current,
                          originFlags,pBVar4,targetFlags.hid,actions);
        BasicHandleInfo::~BasicHandleInfo
                  ((BasicHandleInfo *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30))
        ;
      }
      else {
        in_stack_fffffffffffffd34 = (uint)*(ushort *)((long)&local_10->_M_string_length + 6);
        in_stack_fffffffffffffd44 = (uint)ppVar3->second;
        in_stack_fffffffffffffd28 = local_10;
        in_stack_fffffffffffffd48 =
             (GlobalHandle)
             std::
             make_pair<helics::action_message_def::action_t,helics::action_message_def::action_t>
                       ((action_t *)local_10,(action_t *)0x5f6d23);
        connectInterfaces((CoreBroker *)this_00._M_current,(BasicHandleInfo *)origin._M_current,
                          (uint32_t)((ulong)ppVar3 >> 0x20),pBVar4,targetFlags.hid,actions);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
      ::operator++((__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                    *)&stack0xfffffffffffffea8);
    }
  }
  CLI::std::
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  ::~vector((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  return;
}

Assistant:

void CoreBroker::findAndNotifyInputTargets(BasicHandleInfo& handleInfo, const std::string& key)
{
    auto Handles = unknownHandles.checkForInputs(key);
    for (auto& target : Handles) {
        auto* pub = handles.findHandle(target.first);
        if (pub == nullptr) {
            connectInterfaces(handleInfo,
                              handleInfo.flags,
                              BasicHandleInfo(target.first.fed_id,
                                              target.first.handle,
                                              InterfaceType::PUBLICATION),

                              target.second,
                              std::make_pair(CMD_ADD_SUBSCRIBER, CMD_ADD_PUBLISHER));
        } else {
            connectInterfaces(handleInfo,
                              handleInfo.flags,
                              *pub,

                              target.second,
                              std::make_pair(CMD_ADD_SUBSCRIBER, CMD_ADD_PUBLISHER));
        }
    }
    if (!Handles.empty()) {
        unknownHandles.clearInput(key);
    }
    if (getBrokerState() == BrokerState::OPERATING) {
        Handles = unknownHandles.checkForReconnectionInputs(key);
        for (auto& target : Handles) {
            auto* pub = handles.findHandle(target.first);
            if (pub == nullptr) {
                connectInterfaces(handleInfo,
                                  handleInfo.flags,
                                  BasicHandleInfo(target.first.fed_id,
                                                  target.first.handle,
                                                  InterfaceType::PUBLICATION),

                                  target.second,
                                  std::make_pair(CMD_ADD_SUBSCRIBER, CMD_ADD_PUBLISHER));
            } else {
                connectInterfaces(handleInfo,
                                  handleInfo.flags,
                                  *pub,

                                  target.second,
                                  std::make_pair(CMD_ADD_SUBSCRIBER, CMD_ADD_PUBLISHER));
            }
        }
    }
}